

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

PrepareResult __thiscall Statement::prepareInsert(Statement *this,string *str)

{
  pointer pbVar1;
  uint32_t uVar2;
  int iVar3;
  istream *piVar4;
  PrepareResult PVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string token;
  string cpp;
  string email;
  string username;
  string id;
  string keyword;
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)str,_S_out|_S_in);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&tokens,4);
  keyword._M_dataplus._M_p = (pointer)&keyword.field_2;
  keyword._M_string_length = 0;
  keyword.field_2._M_local_buf[0] = '\0';
  id._M_dataplus._M_p = (pointer)&id.field_2;
  id._M_string_length = 0;
  username._M_dataplus._M_p = (pointer)&username.field_2;
  username._M_string_length = 0;
  id.field_2._M_local_buf[0] = '\0';
  username.field_2._M_local_buf[0] = '\0';
  email._M_dataplus._M_p = (pointer)&email.field_2;
  email._M_string_length = 0;
  email.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&token,' ');
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&tokens,&token);
  }
  if ((long)tokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)tokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    cpp._M_dataplus._M_p = (pointer)&cpp.field_2;
    cpp._M_string_length = 0;
    cpp.field_2._M_local_buf[0] = '\0';
    uVar2 = std::__cxx11::stoi(tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
    (this->rowToInsert).id = uVar2;
    iVar3 = std::__cxx11::stoi(tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
    pbVar1 = tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar3 < 0) {
      PVar5 = PrepareNegativeId;
    }
    else {
      PVar5 = PrepareStringTooLong;
      if (tokens.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length < 0x20) {
        strcpy((this->rowToInsert).username,
               tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
        if (pbVar1[3]._M_string_length < 0x40) {
          strcpy((this->rowToInsert).email,pbVar1[3]._M_dataplus._M_p);
          PVar5 = PrepareSuccess;
        }
      }
    }
    std::__cxx11::string::~string((string *)&cpp);
  }
  else {
    PVar5 = PrepareSyntaxError;
  }
  std::__cxx11::string::~string((string *)&email);
  std::__cxx11::string::~string((string *)&username);
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&keyword);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokens);
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return PVar5;
}

Assistant:

PrepareResult Statement::prepareInsert(std::string str) {
	std::stringstream ss(str);
	std::string token;
	std::vector<std::string> tokens;
	tokens.reserve(4);
	std::string keyword, id, username, email;
	while (getline(ss, token, ' ')) {
		tokens.push_back(token);
	}
	if (tokens.size() != 4)
		return PrepareSyntaxError;

       std::string cpp;
	try {
		rowToInsert.id = stoi(tokens[1]);
	} catch(...) {
		return PrepareSyntaxError;
	}

	if (stoi(tokens[1]) < 0) {
		return PrepareNegativeId;
	}

	if (tokens[2].length() < 32) {
		strcpy(rowToInsert.username, tokens[2].c_str());
	} else {
		return PrepareStringTooLong;
	}

	if (tokens[3].length() < 64) {
		strcpy(rowToInsert.email, tokens[3].c_str());
	} else {
		return PrepareStringTooLong;
	}

	return PrepareSuccess;
}